

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O3

void __thiscall soplex::NameSet::memPack(NameSet *this)

{
  pointer pEVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  int iVar4;
  states *psVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  DataKey *pDVar10;
  Item *pIVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  char *newmem;
  char *local_48;
  DataKey local_40;
  Name local_38;
  
  auVar3 = _DAT_003561b0;
  local_48 = (char *)0x0;
  pEVar1 = (this->hashtab).m_elem.data.
           super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (int)((long)(this->hashtab).m_elem.data.
                      super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 3) * -0x55555555;
  if (0 < (int)uVar7) {
    uVar8 = (ulong)(uVar7 + 3 & 0xfffffffc);
    lVar9 = (ulong)(uVar7 & 0x7fffffff) - 1;
    auVar12._8_4_ = (int)lVar9;
    auVar12._0_8_ = lVar9;
    auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
    psVar5 = (states *)((long)(pEVar1 + 3) + 0x10);
    auVar12 = auVar12 ^ _DAT_003561b0;
    auVar13 = _DAT_00356190;
    auVar14 = _DAT_003561a0;
    do {
      auVar15 = auVar14 ^ auVar3;
      iVar4 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar4 && auVar12._0_4_ < auVar15._0_4_ || iVar4 < auVar15._4_4_)
                & 1)) {
        psVar5[-0x12] = 0;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        psVar5[-0xc] = 0;
      }
      auVar15 = auVar13 ^ auVar3;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar4 && (iVar16 != iVar4 || auVar15._0_4_ <= auVar12._0_4_)) {
        psVar5[-6] = 0;
        *psVar5 = FREE;
      }
      lVar9 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar9 + 4;
      lVar9 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar9 + 4;
      psVar5 = psVar5 + 0x18;
      uVar8 = uVar8 - 4;
    } while (uVar8 != 0);
  }
  (this->hashtab).m_used = 0;
  spx_alloc<char*>(&local_48,this->memused);
  if ((this->set).thenum < 1) {
    iVar4 = 0;
  }
  else {
    pIVar11 = (this->set).theitem;
    pDVar10 = (this->set).thekey;
    lVar9 = 0;
    iVar4 = 0;
    do {
      iVar16 = pIVar11[pDVar10[lVar9].idx].data;
      pcVar2 = this->mem;
      spxSnprintf(local_48 + iVar4,0x400,"%s",pcVar2 + iVar16);
      pIVar11 = (this->set).theitem;
      pDVar10 = (this->set).thekey;
      pIVar11[pDVar10[lVar9].idx].data = iVar4;
      sVar6 = strlen(pcVar2 + iVar16);
      iVar4 = (int)sVar6 + iVar4 + 1;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->set).thenum);
  }
  memcpy(this->mem,local_48,(long)iVar4);
  this->memused = iVar4;
  free(local_48);
  local_48 = (char *)0x0;
  if (0 < (this->set).thenum) {
    lVar9 = 0;
    do {
      pDVar10 = (this->set).thekey;
      local_38.name = this->mem + (this->set).theitem[pDVar10[lVar9].idx].data;
      local_40 = pDVar10[lVar9];
      DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::add(&this->hashtab,&local_38,&local_40)
      ;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->set).thenum);
  }
  return;
}

Assistant:

void NameSet::memPack()
{
   char* newmem = nullptr;
   int   newlast = 0;
   int   i;

   hashtab.clear();

   spx_alloc(newmem, memSize());

   for(i = 0; i < num(); i++)
   {
      const char* t = &mem[set[i]];
      spxSnprintf(&newmem[newlast], SPX_MAXSTRLEN, "%s", t);
      set[i] = newlast;
      newlast += int(strlen(t)) + 1;
   }

   memcpy(mem, newmem, static_cast<size_t>(newlast));
   memused = newlast;

   assert(memSize() <= memMax());

   spx_free(newmem);

   for(i = 0; i < num(); i++)
      hashtab.add(Name(&mem[set[key(i)]]), key(i));
}